

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O1

void __thiscall
dg::llvmdg::SDG2Dot::dumpParams(SDG2Dot *this,ostream *out,DGParameters *params,string *name)

{
  DGNode *pDVar1;
  undefined8 *puVar2;
  DGElement *pDVar3;
  DGParameters *pDVar4;
  ostream *poVar5;
  Value *pVVar6;
  undefined8 *puVar7;
  DGNode *noret;
  DGParameters *__range2;
  DGNode *local_50;
  DGParameters *local_48;
  _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
  *local_40;
  string *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"    subgraph cluster_params_in_",0x1f);
  poVar5 = std::ostream::_M_insert<void_const*>(out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," {\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(out,"      label=\"",0xd);
  local_38 = name;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (input)\"\n",10);
  puVar7 = *(undefined8 **)(params + 0x18);
  puVar2 = *(undefined8 **)(params + 0x20);
  local_48 = params;
  if (puVar7 != puVar2) {
    local_40 = (_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
                *)&this->dumpedNodes;
    do {
      pDVar3 = (DGElement *)*puVar7;
      pDVar1 = (DGNode *)(pDVar3 + 0x20);
      local_50 = pDVar1;
      std::
      _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
      ::_M_insert_unique<dg::sdg::DGNode*>(local_40,&local_50);
      pVVar6 = SystemDependenceGraph::getValue(this->_llvmsdg,pDVar3);
      dumpNode(this,out,pDVar1,pVVar6,(char *)0x0);
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(out,"    subgraph cluster_params_out_",0x20);
  pDVar4 = local_48;
  poVar5 = std::ostream::_M_insert<void_const*>(out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," {\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(out,"      label=\"",0xd);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (output)\"\n",0xb);
  puVar7 = *(undefined8 **)(pDVar4 + 0x18);
  puVar2 = *(undefined8 **)(pDVar4 + 0x20);
  if (puVar7 != puVar2) {
    local_40 = (_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
                *)&this->dumpedNodes;
    do {
      pDVar3 = (DGElement *)*puVar7;
      pDVar1 = (DGNode *)(pDVar3 + 0x220);
      local_50 = pDVar1;
      std::
      _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
      ::_M_insert_unique<dg::sdg::DGNode*>(local_40,&local_50);
      pVVar6 = SystemDependenceGraph::getValue(this->_llvmsdg,pDVar3);
      dumpNode(this,out,pDVar1,pVVar6,(char *)0x0);
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  local_50 = *(DGNode **)(local_48 + 8);
  if (local_50 != (DGNode *)0x0) {
    std::
    _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
    ::_M_insert_unique<dg::sdg::DGNode*const&>
              ((_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
                *)&this->dumpedNodes,&local_50);
    dumpNode(this,out,local_50,(Value *)0x0,"noret");
  }
  local_50 = *(DGNode **)(local_48 + 0x10);
  if (local_50 != (DGNode *)0x0) {
    std::
    _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
    ::_M_insert_unique<dg::sdg::DGNode*const&>
              ((_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
                *)&this->dumpedNodes,&local_50);
    dumpNode(this,out,local_50,(Value *)0x0,"ret");
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"    }\n",6);
  return;
}

Assistant:

void dumpParams(std::ostream &out, sdg::DGParameters &params,
                    const std::string &name) const {
        /// input parameters
        out << "    subgraph cluster_params_in_" << &params << " {\n";
        out << "      label=\"" << name << " (input)\"\n";
        for (auto &param : params) {
            auto &nd = param.getInputArgument();
            dumpedNodes.insert(&nd);
            dumpNode(out, nd, _llvmsdg->getValue(&param));
        }
        out << "    }\n";

        /// output parameters
        out << "    subgraph cluster_params_out_" << &params << " {\n";
        out << "      label=\"" << name << " (output)\"\n";
        for (auto &param : params) {
            auto &nd = param.getOutputArgument();
            dumpedNodes.insert(&nd);
            dumpNode(out, nd, _llvmsdg->getValue(&param));
        }
        if (auto *noret = params.getNoReturn()) {
            dumpedNodes.insert(noret);
            dumpNode(out, *noret, nullptr, "noret");
        }
        if (auto *ret = params.getReturn()) {
            dumpedNodes.insert(ret);
            dumpNode(out, *ret, nullptr, "ret");
        }
        out << "    }\n";
    }